

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardKinematics.cpp
# Opt level: O0

bool iDynTree::ForwardPosVelAccKinematics
               (Model *model,Traversal *traversal,FreeFloatingPos *robotPos,
               FreeFloatingVel *robotVel,FreeFloatingAcc *robotAcc,LinkPositions *linkPos,
               LinkVelArray *linkVel,LinkAccArray *linkAcc)

{
  uint uVar1;
  Link *this;
  Link *this_00;
  IJoint *pIVar2;
  Transform *pTVar3;
  Transform *this_01;
  Twist *pTVar4;
  Twist *this_02;
  SpatialAcc *pSVar5;
  SpatialAcc *this_03;
  JointPosDoubleArray *pJVar6;
  JointDOFsDoubleArray *pJVar7;
  JointDOFsDoubleArray *pJVar8;
  LinkIndex LVar9;
  FreeFloatingVel *in_RCX;
  FreeFloatingPos *in_RDX;
  FreeFloatingAcc *in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  TraversalIndex in_stack_00000010;
  IJointConstPtr toParentJoint;
  LinkConstPtr parentLink;
  LinkConstPtr visitedLink;
  uint traversalEl;
  bool retValue;
  TraversalIndex in_stack_ffffffffffffff18;
  Traversal *in_stack_ffffffffffffff20;
  uint local_40;
  
  local_40 = 0;
  while( true ) {
    uVar1 = Traversal::getNrOfVisitedLinks((Traversal *)0x3b88e6);
    if (uVar1 <= local_40) break;
    this = Traversal::getLink(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    this_00 = Traversal::getParentLink(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    pIVar2 = Traversal::getParentJoint(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (this_00 == (Link *)0x0) {
      pTVar3 = FreeFloatingPos::worldBasePos(in_RDX);
      Link::getIndex(this);
      this_01 = LinkPositions::operator()
                          ((LinkPositions *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      iDynTree::Transform::operator=(this_01,pTVar3);
      pTVar4 = FreeFloatingVel::baseVel(in_RCX);
      Link::getIndex(this);
      this_02 = LinkVelArray::operator()
                          ((LinkVelArray *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      iDynTree::Twist::operator=(this_02,pTVar4);
      pSVar5 = FreeFloatingAcc::baseAcc(in_R8);
      Link::getIndex(this);
      this_03 = LinkAccArray::operator()
                          ((LinkAccArray *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      iDynTree::SpatialAcc::operator=(this_03,pSVar5);
    }
    else {
      pJVar6 = FreeFloatingPos::jointPos(in_RDX);
      pJVar7 = FreeFloatingVel::jointVel(in_RCX);
      pJVar8 = FreeFloatingAcc::jointAcc(in_R8);
      in_stack_ffffffffffffff18 = in_stack_00000010;
      in_stack_ffffffffffffff20 = (Traversal *)Link::getIndex(this);
      LVar9 = Link::getIndex(this_00);
      (*pIVar2->_vptr_IJoint[0xd])
                (pIVar2,pJVar6,pJVar7,pJVar8,in_R9,in_stack_00000008,in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff20,LVar9);
    }
    local_40 = local_40 + 1;
  }
  return true;
}

Assistant:

bool ForwardPosVelAccKinematics(const Model& model, const Traversal& traversal,
                                const FreeFloatingPos& robotPos,
                                const FreeFloatingVel& robotVel,
                                const FreeFloatingAcc& robotAcc,
                                      LinkPositions& linkPos,
                                      LinkVelArray & linkVel,
                                      LinkAccArray & linkAcc)
{
    bool retValue = true;

    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        if( parentLink == 0 )
        {
            // If the visited link is the base, the base has no parent.
            // In this case the position of the base with respect to the world is simply
            // the worldBase transform contained in the jointPos input object
            linkPos(visitedLink->getIndex()) = robotPos.worldBasePos();
            linkVel(visitedLink->getIndex()) = robotVel.baseVel();
            linkAcc(visitedLink->getIndex()) = robotAcc.baseAcc();
        }
        else
        {
            // Otherwise we compute the world_H_link transform as:
            // world_H_link = world_H_parentLink * parentLink_H_link
            // The link velocity and acceleration are recursivly
            // compute from the joint position, velocity and acceleration
            // and from the velocity and acceleration of the parent link
            toParentJoint->computeChildPosVelAcc(robotPos.jointPos(),
                                                 robotVel.jointVel(),
                                                 robotAcc.jointAcc(),
                                                 linkPos, linkVel, linkAcc,
                                                 visitedLink->getIndex(),parentLink->getIndex());
        }
    }

    return retValue;

}